

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O0

void __thiscall TreeWalker::acceptButtonGroups(TreeWalker *this,DomButtonGroups *domButtonGroups)

{
  bool bVar1;
  const_iterator o;
  DomButtonGroup **ppDVar2;
  DomButtonGroups *in_RDI;
  long in_FS_OFFSET;
  DomButtonGroup *g;
  QList<DomButtonGroup_*> *__range1;
  QList<DomButtonGroup_*> *domGroups;
  const_iterator __end1;
  const_iterator __begin1;
  QList<DomButtonGroup_*> *in_stack_ffffffffffffffa0;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DomButtonGroups::elementButtonGroup(in_RDI);
  local_28[0].i = (DomButtonGroup **)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<DomButtonGroup_*>::begin(in_stack_ffffffffffffffa0);
  o = QList<DomButtonGroup_*>::end(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = QList<DomButtonGroup_*>::const_iterator::operator!=(local_28,o);
    if (!bVar1) break;
    ppDVar2 = QList<DomButtonGroup_*>::const_iterator::operator*(local_28);
    (**(code **)(*(long *)in_RDI + 0x110))(in_RDI,*ppDVar2);
    QList<DomButtonGroup_*>::const_iterator::operator++(local_28);
  }
  QList<DomButtonGroup_*>::~QList((QList<DomButtonGroup_*> *)0x1991b9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptButtonGroups(const DomButtonGroups *domButtonGroups)
{
    const auto &domGroups = domButtonGroups->elementButtonGroup();
    for (const DomButtonGroup *g : domGroups)
        acceptButtonGroup(g);
}